

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

bool __thiscall
helics::apps::Connector::makePotentialTemplateConnection
          (Connector *this,string_view interface,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *tagList,
          vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
          *potentialTemplates,
          unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          *aliases)

{
  string_view testString;
  string_view target;
  string_view testString_00;
  bool bVar1;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *ptVar2;
  undefined8 in_R8;
  optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  match_1;
  TemplateMatcher *matcher_1;
  iterator __end4;
  iterator __begin4;
  vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_> *__range4;
  basic_string_view<char,_std::char_traits<char>_> *alias;
  iterator __end3_1;
  iterator __begin3_1;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range3_1;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  aliasList;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000120;
  Connector *in_stack_00000128;
  string_view in_stack_00000130;
  optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  match;
  TemplateMatcher *matcher;
  iterator __end3;
  iterator __begin3;
  vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_> *__range3;
  Connection *option;
  iterator __end2;
  iterator __begin2;
  vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> *__range2;
  vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> connectionOptions;
  reference in_stack_fffffffffffffdb8;
  reference this_00;
  __normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
  *in_stack_fffffffffffffdc0;
  vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
  *in_stack_fffffffffffffdd0;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *in_stack_fffffffffffffdd8;
  TemplateMatcher *in_stack_fffffffffffffde0;
  __normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
  local_1a8;
  undefined8 local_1a0;
  reference local_198;
  _Self local_190;
  _Self local_188;
  undefined1 *local_180;
  size_t local_178;
  char *pcStack_170;
  undefined1 local_160 [52];
  int local_12c;
  size_t local_128;
  char *pcStack_120;
  size_t local_118;
  char *pcStack_110;
  size_t local_108;
  char *pcStack_100;
  TemplateMatcher *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  __normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
  local_90;
  undefined8 local_88;
  reference local_80;
  Connection *local_78;
  __normal_iterator<helics::apps::Connection_*,_std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>_>
  local_70;
  undefined1 *local_68;
  undefined1 local_50 [32];
  undefined8 local_30;
  byte local_1;
  
  local_30 = in_R8;
  buildPossibleConnectionList(in_stack_00000128,in_stack_00000130,in_stack_00000120);
  local_68 = local_50;
  local_70._M_current =
       (Connection *)
       CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::begin
                 ((vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> *)
                  in_stack_fffffffffffffdb8);
  local_78 = (Connection *)
             CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::
             end((vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> *)
                 in_stack_fffffffffffffdb8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<helics::apps::Connection_*,_std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>_>
                      ((__normal_iterator<helics::apps::Connection_*,_std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>_>
                        *)in_stack_fffffffffffffdc0,
                       (__normal_iterator<helics::apps::Connection_*,_std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>_>
                        *)in_stack_fffffffffffffdb8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_80 = __gnu_cxx::
               __normal_iterator<helics::apps::Connection_*,_std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>_>
               ::operator*(&local_70);
    local_88 = local_30;
    local_90._M_current =
         (TemplateMatcher *)
         CLI::std::
         vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>::
         begin((vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                *)in_stack_fffffffffffffdb8);
    CLI::std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
    ::end((vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_> *)
          in_stack_fffffffffffffdb8);
    this_00 = in_stack_fffffffffffffdb8;
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
                        (in_stack_fffffffffffffdc0,
                         (__normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
                          *)this_00);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      __gnu_cxx::
      __normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
      ::operator*(&local_90);
      in_stack_ffffffffffffff18 = (TemplateMatcher *)(local_80->interface2)._M_len;
      in_stack_ffffffffffffff20 = (local_80->interface2)._M_str;
      testString._M_str = in_stack_ffffffffffffff28;
      testString._M_len = (size_t)in_stack_ffffffffffffff20;
      TemplateMatcher::isTemplateMatch(in_stack_ffffffffffffff18,testString);
      bVar1 = std::optional::operator_cast_to_bool
                        ((optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)0x26568a);
      if (bVar1) {
        ptVar2 = CLI::std::
                 optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::operator*((optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              *)0x2656ad);
        local_128 = (ptVar2->
                    super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    ).
                    super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    .super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
                    super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                    ._M_head_impl._M_len;
        pcStack_120 = (ptVar2->
                      super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                      ).
                      super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                      .
                      super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_>
                      .
                      super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                      ._M_head_impl._M_str;
        local_118 = (ptVar2->
                    super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    ).
                    super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    .
                    super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                    ._M_head_impl._M_len;
        pcStack_110 = (ptVar2->
                      super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                      ).
                      super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                      .
                      super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                      ._M_head_impl._M_str;
        local_108 = (ptVar2->
                    super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    ).
                    super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                    ._M_head_impl._M_len;
        pcStack_100 = (ptVar2->
                      super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                      ).
                      super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                      ._M_head_impl._M_str;
        TemplateMatcher::setAsUsed(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        local_1 = 1;
        local_12c = 1;
        goto LAB_0026596f;
      }
      __gnu_cxx::
      __normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
      ::operator++(&local_90);
    }
    local_178 = (local_80->interface2)._M_len;
    pcStack_170 = (local_80->interface2)._M_str;
    target._M_str = in_stack_ffffffffffffff28;
    target._M_len = (size_t)in_stack_ffffffffffffff20;
    generateAliases(target,(unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                            *)in_stack_ffffffffffffff18);
    local_180 = local_160;
    local_188._M_node =
         (_Base_ptr)
         CLI::std::
         set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         ::begin((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)this_00);
    local_190._M_node =
         (_Base_ptr)
         CLI::std::
         set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         ::end((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)this_00);
    while( true ) {
      bVar1 = CLI::std::operator==(&local_188,&local_190);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_198 = CLI::std::
                  _Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>::
                  operator*((_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>
                             *)0x2657cb);
      local_1a0 = local_30;
      local_1a8._M_current =
           (TemplateMatcher *)
           CLI::std::
           vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>::
           begin((vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                  *)this_00);
      CLI::std::
      vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>::end
                ((vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                  *)this_00);
      while( true ) {
        bVar1 = __gnu_cxx::
                operator==<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
                          (in_stack_fffffffffffffdc0,
                           (__normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
                            *)this_00);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        in_stack_fffffffffffffdb8 =
             __gnu_cxx::
             __normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
             ::operator*(&local_1a8);
        testString_00._M_str = in_stack_ffffffffffffff28;
        testString_00._M_len = (size_t)in_stack_ffffffffffffff20;
        TemplateMatcher::isTemplateMatch(in_stack_ffffffffffffff18,testString_00);
        bVar1 = std::optional::operator_cast_to_bool
                          ((optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            *)0x26587a);
        if (bVar1) {
          ptVar2 = CLI::std::
                   optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::operator*((optional<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                *)0x265896);
          in_stack_fffffffffffffdd0 =
               (vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> *)
               (ptVar2->
               super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               ).
               super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
               super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
               _M_head_impl._M_str;
          in_stack_fffffffffffffdd8 =
               (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                *)(ptVar2->
                  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                  ).
                  super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                  .
                  super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                  ._M_head_impl._M_len;
          in_stack_fffffffffffffde0 =
               (TemplateMatcher *)
               (ptVar2->
               super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               ).
               super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
               .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
               _M_head_impl._M_str;
          TemplateMatcher::setAsUsed(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
          local_1 = 1;
          local_12c = 1;
          goto LAB_0026592e;
        }
        __gnu_cxx::
        __normal_iterator<helics::apps::TemplateMatcher_*,_std::vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>_>
        ::operator++(&local_1a8);
      }
      CLI::std::_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>::
      operator++((_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                 in_stack_fffffffffffffdc0);
    }
    local_12c = 0;
    in_stack_fffffffffffffdb8 = this_00;
LAB_0026592e:
    CLI::std::
    set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~set((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)0x26593b);
    if (local_12c != 0) goto LAB_0026596f;
    __gnu_cxx::
    __normal_iterator<helics::apps::Connection_*,_std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>_>
    ::operator++(&local_70);
  }
  local_1 = 0;
  local_12c = 1;
LAB_0026596f:
  CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::~vector
            (in_stack_fffffffffffffdd0);
  return (bool)(local_1 & 1);
}

Assistant:

bool Connector::makePotentialTemplateConnection(
    std::string_view interface,
    const std::vector<std::size_t>& tagList,
    std::vector<TemplateMatcher>& potentialTemplates,
    const std::unordered_multimap<std::string_view, std::string_view>& aliases)
{
    auto connectionOptions = buildPossibleConnectionList(interface, tagList);
    for (const auto& option : connectionOptions) {
        for (auto& matcher : potentialTemplates) {
            auto match = matcher.isTemplateMatch(option.interface2);
            if (match) {
                matcher.setAsUsed(*match);
                return true;
            }
        }
        auto aliasList = generateAliases(option.interface2, aliases);
        for (const auto& alias : aliasList) {
            for (auto& matcher : potentialTemplates) {
                auto match = matcher.isTemplateMatch(alias);
                if (match) {
                    matcher.setAsUsed(*match);
                    return true;
                }
            }
        }
    }
    return false;
}